

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  uint uVar29;
  undefined1 (*pauVar30) [16];
  AABBNodeMB4D *node1;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar43 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar55;
  undefined1 auVar54 [16];
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar67 [16];
  undefined1 auVar70 [32];
  float fVar73;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  float fVar79;
  undefined1 auVar78 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [64];
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [64];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar114;
  undefined1 auVar109 [32];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar110 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar120 [32];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  undefined4 uStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar43 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar42 = vrsqrtss_avx(auVar43,auVar43);
    fVar108 = auVar42._0_4_;
    local_24c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_24bc = local_24c0;
    fStack_24b8 = local_24c0;
    fStack_24b4 = local_24c0;
    fStack_24b0 = local_24c0;
    fStack_24ac = local_24c0;
    fStack_24a8 = local_24c0;
    fStack_24a4 = local_24c0;
    local_24e0 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_24dc = local_24e0;
    fStack_24d8 = local_24e0;
    fStack_24d4 = local_24e0;
    fStack_24d0 = local_24e0;
    fStack_24cc = local_24e0;
    fStack_24c8 = local_24e0;
    fStack_24c4 = local_24e0;
    local_23e0[0] = fVar108 * 1.5 - auVar43._0_4_ * 0.5 * fVar108 * fVar108 * fVar108;
    local_2500 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_24fc = local_2500;
    fStack_24f8 = local_2500;
    fStack_24f4 = local_2500;
    fStack_24f0 = local_2500;
    fStack_24ec = local_2500;
    fStack_24e8 = local_2500;
    fStack_24e4 = local_2500;
    auVar56 = vshufps_avx(ZEXT416((uint)local_23e0[0]),ZEXT416((uint)local_23e0[0]),0);
    auVar64._0_4_ = aVar3.x * auVar56._0_4_;
    auVar64._4_4_ = aVar3.y * auVar56._4_4_;
    auVar64._8_4_ = aVar3.z * auVar56._8_4_;
    auVar64._12_4_ = aVar3.field_3.w * auVar56._12_4_;
    auVar42 = vshufpd_avx(auVar64,auVar64,1);
    auVar43 = vmovshdup_avx(auVar64);
    auVar86._8_4_ = 0x80000000;
    auVar86._0_8_ = 0x8000000080000000;
    auVar86._12_4_ = 0x80000000;
    auVar74._12_4_ = 0;
    auVar74._0_12_ = ZEXT812(0);
    auVar74 = auVar74 << 0x20;
    auVar54 = vunpckhps_avx(auVar64,auVar74);
    auVar39 = vshufps_avx(auVar54,ZEXT416(auVar43._0_4_ ^ 0x80000000),0x41);
    auVar54._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar54._8_8_ = auVar86._8_8_ ^ auVar42._8_8_;
    auVar54 = vinsertps_avx(auVar54,auVar64,0x2a);
    auVar43 = vdpps_avx(auVar39,auVar39,0x7f);
    auVar42 = vdpps_avx(auVar54,auVar54,0x7f);
    auVar43 = vcmpps_avx(auVar42,auVar43,1);
    auVar43 = vshufps_avx(auVar43,auVar43,0);
    auVar43 = vblendvps_avx(auVar54,auVar39,auVar43);
    auVar42 = vdpps_avx(auVar43,auVar43,0x7f);
    auVar54 = vrsqrtss_avx(auVar42,auVar42);
    fVar108 = auVar54._0_4_;
    auVar42 = ZEXT416((uint)(fVar108 * 1.5 - auVar42._0_4_ * 0.5 * fVar108 * fVar108 * fVar108));
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar80._0_4_ = auVar43._0_4_ * auVar42._0_4_;
    auVar80._4_4_ = auVar43._4_4_ * auVar42._4_4_;
    auVar80._8_4_ = auVar43._8_4_ * auVar42._8_4_;
    auVar80._12_4_ = auVar43._12_4_ * auVar42._12_4_;
    auVar43 = vshufps_avx(auVar80,auVar80,0xc9);
    auVar42 = vshufps_avx(auVar64,auVar64,0xc9);
    auVar87._0_4_ = auVar42._0_4_ * auVar80._0_4_;
    auVar87._4_4_ = auVar42._4_4_ * auVar80._4_4_;
    auVar87._8_4_ = auVar42._8_4_ * auVar80._8_4_;
    auVar87._12_4_ = auVar42._12_4_ * auVar80._12_4_;
    auVar84._0_4_ = auVar64._0_4_ * auVar43._0_4_;
    auVar84._4_4_ = auVar64._4_4_ * auVar43._4_4_;
    auVar84._8_4_ = auVar64._8_4_ * auVar43._8_4_;
    auVar84._12_4_ = auVar64._12_4_ * auVar43._12_4_;
    auVar43 = vsubps_avx(auVar84,auVar87);
    auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar43 = vdpps_avx(auVar54,auVar54,0x7f);
    auVar42 = vrsqrtss_avx(auVar43,auVar43);
    fVar108 = auVar42._0_4_;
    auVar43 = ZEXT416((uint)(fVar108 * 1.5 - fVar108 * fVar108 * fVar108 * auVar43._0_4_ * 0.5));
    auVar43 = vshufps_avx(auVar43,auVar43,0);
    auVar42._0_4_ = auVar43._0_4_ * auVar54._0_4_;
    auVar42._4_4_ = auVar43._4_4_ * auVar54._4_4_;
    auVar42._8_4_ = auVar43._8_4_ * auVar54._8_4_;
    auVar42._12_4_ = auVar43._12_4_ * auVar54._12_4_;
    auVar43._0_4_ = auVar56._0_4_ * auVar64._0_4_;
    auVar43._4_4_ = auVar56._4_4_ * auVar64._4_4_;
    auVar43._8_4_ = auVar56._8_4_ * auVar64._8_4_;
    auVar43._12_4_ = auVar56._12_4_ * auVar64._12_4_;
    auVar54 = vunpcklps_avx(auVar80,auVar43);
    auVar43 = vunpckhps_avx(auVar80,auVar43);
    auVar56 = vunpcklps_avx(auVar42,auVar74);
    auVar42 = vunpckhps_avx(auVar42,auVar74);
    local_23b0 = vunpcklps_avx(auVar43,auVar42);
    local_23d0 = vunpcklps_avx(auVar54,auVar56);
    local_23c0 = vunpckhps_avx(auVar54,auVar56);
    pauVar35 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar78 = ZEXT464(0) << 0x20;
    auVar42 = vmaxss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar53 = ZEXT1664(auVar42);
    auVar54 = vmaxss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar56._8_4_ = 0x7fffffff;
    auVar56._0_8_ = 0x7fffffff7fffffff;
    auVar56._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx((undefined1  [16])aVar3,auVar56);
    auVar65._8_4_ = 0x219392ef;
    auVar65._0_8_ = 0x219392ef219392ef;
    auVar65._12_4_ = 0x219392ef;
    auVar43 = vcmpps_avx(auVar43,auVar65,1);
    auVar43 = vblendvps_avx((undefined1  [16])aVar3,auVar65,auVar43);
    auVar56 = vrcpps_avx(auVar43);
    fVar108 = auVar56._0_4_;
    auVar39._0_4_ = auVar43._0_4_ * fVar108;
    fVar89 = auVar56._4_4_;
    auVar39._4_4_ = auVar43._4_4_ * fVar89;
    fVar111 = auVar56._8_4_;
    auVar39._8_4_ = auVar43._8_4_ * fVar111;
    fVar93 = auVar56._12_4_;
    auVar39._12_4_ = auVar43._12_4_ * fVar93;
    auVar66._8_4_ = 0x3f800000;
    auVar66._0_8_ = 0x3f8000003f800000;
    auVar66._12_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar66,auVar39);
    auVar40._0_4_ = fVar108 + fVar108 * auVar43._0_4_;
    auVar40._4_4_ = fVar89 + fVar89 * auVar43._4_4_;
    auVar40._8_4_ = fVar111 + fVar111 * auVar43._8_4_;
    auVar40._12_4_ = fVar93 + fVar93 * auVar43._12_4_;
    local_2520 = (ray->super_RayK<1>).org.field_0.m128[0];
    fStack_251c = local_2520;
    fStack_2518 = local_2520;
    fStack_2514 = local_2520;
    fStack_2510 = local_2520;
    fStack_250c = local_2520;
    fStack_2508 = local_2520;
    fStack_2504 = local_2520;
    local_2540 = (ray->super_RayK<1>).org.field_0.m128[1];
    fStack_253c = local_2540;
    fStack_2538 = local_2540;
    fStack_2534 = local_2540;
    fStack_2530 = local_2540;
    fStack_252c = local_2540;
    fStack_2528 = local_2540;
    fStack_2524 = local_2540;
    local_2560 = (ray->super_RayK<1>).org.field_0.m128[2];
    fStack_255c = local_2560;
    fStack_2558 = local_2560;
    fStack_2554 = local_2560;
    fStack_2550 = local_2560;
    fStack_254c = local_2560;
    fStack_2548 = local_2560;
    fStack_2544 = local_2560;
    auVar43 = vshufps_avx(auVar40,auVar40,0);
    local_2580._16_16_ = auVar43;
    local_2580._0_16_ = auVar43;
    auVar92 = ZEXT3264(local_2580);
    auVar43 = vmovshdup_avx(auVar40);
    auVar63 = ZEXT1664(auVar43);
    auVar56 = vshufps_avx(auVar40,auVar40,0x55);
    local_25a0._16_16_ = auVar56;
    local_25a0._0_16_ = auVar56;
    auVar100 = ZEXT3264(local_25a0);
    auVar56 = vshufpd_avx(auVar40,auVar40,1);
    auVar72 = ZEXT1664(auVar56);
    auVar39 = vshufps_avx(auVar40,auVar40,0xaa);
    local_25c0._16_16_ = auVar39;
    local_25c0._0_16_ = auVar39;
    auVar107 = ZEXT3264(local_25c0);
    uVar36 = (ulong)(auVar40._0_4_ < 0.0) * 0x20;
    uVar38 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x40;
    uVar37 = (ulong)(auVar56._0_4_ < 0.0) << 5 | 0x80;
    auVar43 = vshufps_avx(auVar42,auVar42,0);
    local_25e0._16_16_ = auVar43;
    local_25e0._0_16_ = auVar43;
    auVar110 = ZEXT3264(local_25e0);
    auVar43 = vshufps_avx(auVar54,auVar54,0);
    auVar41 = ZEXT3264(CONCAT1616(auVar43,auVar43));
LAB_00e4eafa:
    if (pauVar35 != (undefined1 (*) [16])&local_23a0) {
      pauVar30 = pauVar35 + -1;
      pauVar35 = pauVar35 + -1;
      if (*(float *)(*pauVar30 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar33 = *(ulong *)*pauVar35;
        while ((uVar33 & 8) == 0) {
          fVar108 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar29 = (uint)uVar33 & 7;
          uVar31 = uVar33 & 0xfffffffffffffff0;
          if (uVar29 == 3) {
            local_2440 = *(float *)(uVar31 + 0x40);
            fStack_243c = *(float *)(uVar31 + 0x44);
            fStack_2438 = *(float *)(uVar31 + 0x48);
            fStack_2434 = *(float *)(uVar31 + 0x4c);
            fStack_2430 = *(float *)(uVar31 + 0x50);
            fStack_242c = *(float *)(uVar31 + 0x54);
            fStack_2428 = *(float *)(uVar31 + 0x58);
            uStack_2424 = *(undefined4 *)(uVar31 + 0x5c);
            local_2480 = *(float *)(uVar31 + 0xc0);
            fStack_247c = *(float *)(uVar31 + 0xc4);
            fStack_2478 = *(float *)(uVar31 + 200);
            fStack_2474 = *(float *)(uVar31 + 0xcc);
            fStack_2470 = *(float *)(uVar31 + 0xd0);
            fStack_246c = *(float *)(uVar31 + 0xd4);
            fStack_2468 = *(float *)(uVar31 + 0xd8);
            uStack_2464 = *(undefined4 *)(uVar31 + 0xdc);
            local_2460 = *(float *)(uVar31 + 0xe0);
            fStack_245c = *(float *)(uVar31 + 0xe4);
            fStack_2458 = *(float *)(uVar31 + 0xe8);
            fStack_2454 = *(float *)(uVar31 + 0xec);
            fStack_2450 = *(float *)(uVar31 + 0xf0);
            fStack_244c = *(float *)(uVar31 + 0xf4);
            fStack_2448 = *(float *)(uVar31 + 0xf8);
            uStack_2444 = *(undefined4 *)(uVar31 + 0xfc);
            auVar43 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            fVar112 = auVar43._0_4_;
            fVar94 = auVar43._4_4_;
            fVar114 = auVar43._8_4_;
            fVar95 = auVar43._12_4_;
            fVar108 = 1.0 - fVar108;
            auVar43 = vshufps_avx(ZEXT416((uint)(fVar108 * 0.0)),ZEXT416((uint)(fVar108 * 0.0)),0);
            fStack_2410 = auVar43._0_4_;
            fStack_240c = auVar43._4_4_;
            fStack_2408 = auVar43._8_4_;
            fVar113 = auVar43._12_4_;
            local_2640._4_4_ = fStack_240c + fVar94 * *(float *)(uVar31 + 0x1c4);
            local_2640._0_4_ = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x1c0);
            fStack_2638 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x1c8);
            fStack_2634 = fVar113 + fVar95 * *(float *)(uVar31 + 0x1cc);
            fStack_2630 = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x1d0);
            fStack_262c = fStack_240c + fVar94 * *(float *)(uVar31 + 0x1d4);
            fStack_2628 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x1d8);
            fStack_2624 = fVar113 + 0.0;
            local_2400 = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x1e0);
            fStack_23fc = fStack_240c + fVar94 * *(float *)(uVar31 + 0x1e4);
            fStack_23f8 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x1e8);
            fStack_23f4 = fVar113 + fVar95 * *(float *)(uVar31 + 0x1ec);
            fStack_23f0 = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x1f0);
            fStack_23ec = fStack_240c + fVar94 * *(float *)(uVar31 + 500);
            fStack_23e8 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x1f8);
            fStack_23e4 = fVar113 + auVar92._28_4_;
            local_2420 = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x200);
            fStack_241c = fStack_240c + fVar94 * *(float *)(uVar31 + 0x204);
            fStack_2418 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x208);
            fStack_2414 = fVar113 + fVar95 * *(float *)(uVar31 + 0x20c);
            fStack_2410 = fStack_2410 + fVar112 * *(float *)(uVar31 + 0x210);
            fStack_240c = fStack_240c + fVar94 * *(float *)(uVar31 + 0x214);
            fStack_2408 = fStack_2408 + fVar114 * *(float *)(uVar31 + 0x218);
            fVar7 = auVar107._28_4_;
            fStack_2404 = fVar113 + fVar7;
            auVar60._0_4_ =
                 local_24c0 * local_2440 +
                 local_24e0 * *(float *)(uVar31 + 0xa0) + *(float *)(uVar31 + 0x100) * local_2500;
            auVar60._4_4_ =
                 fStack_24bc * fStack_243c +
                 fStack_24dc * *(float *)(uVar31 + 0xa4) + *(float *)(uVar31 + 0x104) * fStack_24fc;
            auVar60._8_4_ =
                 fStack_24b8 * fStack_2438 +
                 fStack_24d8 * *(float *)(uVar31 + 0xa8) + *(float *)(uVar31 + 0x108) * fStack_24f8;
            auVar60._12_4_ =
                 fStack_24b4 * fStack_2434 +
                 fStack_24d4 * *(float *)(uVar31 + 0xac) + *(float *)(uVar31 + 0x10c) * fStack_24f4;
            auVar60._16_4_ =
                 fStack_24b0 * fStack_2430 +
                 fStack_24d0 * *(float *)(uVar31 + 0xb0) + *(float *)(uVar31 + 0x110) * fStack_24f0;
            auVar60._20_4_ =
                 fStack_24ac * fStack_242c +
                 fStack_24cc * *(float *)(uVar31 + 0xb4) + *(float *)(uVar31 + 0x114) * fStack_24ec;
            auVar60._24_4_ =
                 fStack_24a8 * fStack_2428 +
                 fStack_24c8 * *(float *)(uVar31 + 0xb8) + *(float *)(uVar31 + 0x118) * fStack_24e8;
            auVar60._28_4_ = fVar7 + in_ZMM14._28_4_ + 0.0;
            auVar119._0_4_ =
                 local_24c0 * *(float *)(uVar31 + 0x60) +
                 local_2480 * local_24e0 + local_2500 * *(float *)(uVar31 + 0x120);
            auVar119._4_4_ =
                 fStack_24bc * *(float *)(uVar31 + 100) +
                 fStack_247c * fStack_24dc + fStack_24fc * *(float *)(uVar31 + 0x124);
            auVar119._8_4_ =
                 fStack_24b8 * *(float *)(uVar31 + 0x68) +
                 fStack_2478 * fStack_24d8 + fStack_24f8 * *(float *)(uVar31 + 0x128);
            auVar119._12_4_ =
                 fStack_24b4 * *(float *)(uVar31 + 0x6c) +
                 fStack_2474 * fStack_24d4 + fStack_24f4 * *(float *)(uVar31 + 300);
            auVar119._16_4_ =
                 fStack_24b0 * *(float *)(uVar31 + 0x70) +
                 fStack_2470 * fStack_24d0 + fStack_24f0 * *(float *)(uVar31 + 0x130);
            auVar119._20_4_ =
                 fStack_24ac * *(float *)(uVar31 + 0x74) +
                 fStack_246c * fStack_24cc + fStack_24ec * *(float *)(uVar31 + 0x134);
            auVar119._24_4_ =
                 fStack_24a8 * *(float *)(uVar31 + 0x78) +
                 fStack_2468 * fStack_24c8 + fStack_24e8 * *(float *)(uVar31 + 0x138);
            auVar119._28_4_ = fVar113 + in_ZMM14._28_4_ + fVar7;
            auVar90._0_4_ =
                 *(float *)(uVar31 + 0x80) * local_24c0 +
                 local_24e0 * local_2460 + *(float *)(uVar31 + 0x140) * local_2500;
            auVar90._4_4_ =
                 *(float *)(uVar31 + 0x84) * fStack_24bc +
                 fStack_24dc * fStack_245c + *(float *)(uVar31 + 0x144) * fStack_24fc;
            auVar90._8_4_ =
                 *(float *)(uVar31 + 0x88) * fStack_24b8 +
                 fStack_24d8 * fStack_2458 + *(float *)(uVar31 + 0x148) * fStack_24f8;
            auVar90._12_4_ =
                 *(float *)(uVar31 + 0x8c) * fStack_24b4 +
                 fStack_24d4 * fStack_2454 + *(float *)(uVar31 + 0x14c) * fStack_24f4;
            auVar90._16_4_ =
                 *(float *)(uVar31 + 0x90) * fStack_24b0 +
                 fStack_24d0 * fStack_2450 + *(float *)(uVar31 + 0x150) * fStack_24f0;
            auVar90._20_4_ =
                 *(float *)(uVar31 + 0x94) * fStack_24ac +
                 fStack_24cc * fStack_244c + *(float *)(uVar31 + 0x154) * fStack_24ec;
            auVar90._24_4_ =
                 *(float *)(uVar31 + 0x98) * fStack_24a8 +
                 fStack_24c8 * fStack_2448 + *(float *)(uVar31 + 0x158) * fStack_24e8;
            auVar90._28_4_ = auVar92._28_4_ + fVar7 + fVar113;
            auVar48._8_4_ = 0x7fffffff;
            auVar48._0_8_ = 0x7fffffff7fffffff;
            auVar48._12_4_ = 0x7fffffff;
            auVar48._16_4_ = 0x7fffffff;
            auVar48._20_4_ = 0x7fffffff;
            auVar48._24_4_ = 0x7fffffff;
            auVar48._28_4_ = 0x7fffffff;
            auVar91 = vandps_avx(auVar60,auVar48);
            auVar70._8_4_ = 0x219392ef;
            auVar70._0_8_ = 0x219392ef219392ef;
            auVar70._12_4_ = 0x219392ef;
            auVar70._16_4_ = 0x219392ef;
            auVar70._20_4_ = 0x219392ef;
            auVar70._24_4_ = 0x219392ef;
            auVar70._28_4_ = 0x219392ef;
            auVar91 = vcmpps_avx(auVar91,auVar70,1);
            auVar71 = vblendvps_avx(auVar60,auVar70,auVar91);
            auVar91 = vandps_avx(auVar119,auVar48);
            auVar91 = vcmpps_avx(auVar91,auVar70,1);
            auVar9 = vblendvps_avx(auVar119,auVar70,auVar91);
            auVar91 = vandps_avx(auVar90,auVar48);
            auVar8 = vcmpps_avx(auVar91,auVar70,1);
            auVar91 = vblendvps_avx(auVar90,auVar70,auVar8);
            auVar43 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            fVar108 = auVar43._0_4_;
            auVar118._0_4_ = fVar112 * *(float *)(uVar31 + 0x220) + fVar108;
            fVar89 = auVar43._4_4_;
            auVar118._4_4_ = fVar94 * *(float *)(uVar31 + 0x224) + fVar89;
            fVar111 = auVar43._8_4_;
            auVar118._8_4_ = fVar114 * *(float *)(uVar31 + 0x228) + fVar111;
            fVar93 = auVar43._12_4_;
            auVar118._12_4_ = fVar95 * *(float *)(uVar31 + 0x22c) + fVar93;
            auVar118._16_4_ = fVar112 * *(float *)(uVar31 + 0x230) + fVar108;
            auVar118._20_4_ = fVar94 * *(float *)(uVar31 + 0x234) + fVar89;
            auVar118._24_4_ = fVar114 * *(float *)(uVar31 + 0x238) + fVar111;
            auVar118._28_4_ = auVar90._28_4_ + fVar93;
            local_24a0 = fVar112 * *(float *)(uVar31 + 0x240) + fVar108;
            fStack_249c = fVar94 * *(float *)(uVar31 + 0x244) + fVar89;
            fStack_2498 = fVar114 * *(float *)(uVar31 + 0x248) + fVar111;
            fStack_2494 = fVar95 * *(float *)(uVar31 + 0x24c) + fVar93;
            fStack_2490 = fVar112 * *(float *)(uVar31 + 0x250) + fVar108;
            fStack_248c = fVar94 * *(float *)(uVar31 + 0x254) + fVar89;
            fStack_2488 = fVar114 * *(float *)(uVar31 + 600) + fVar111;
            fStack_2484 = auVar8._28_4_ + fVar93;
            auVar120._0_4_ = fVar108 + fVar112 * *(float *)(uVar31 + 0x260);
            auVar120._4_4_ = fVar89 + fVar94 * *(float *)(uVar31 + 0x264);
            auVar120._8_4_ = fVar111 + fVar114 * *(float *)(uVar31 + 0x268);
            auVar120._12_4_ = fVar93 + fVar95 * *(float *)(uVar31 + 0x26c);
            auVar120._16_4_ = fVar108 + fVar112 * *(float *)(uVar31 + 0x270);
            auVar120._20_4_ = fVar89 + fVar94 * *(float *)(uVar31 + 0x274);
            auVar120._24_4_ = fVar111 + fVar114 * *(float *)(uVar31 + 0x278);
            auVar120._28_4_ = fVar93 + NAN;
            auVar8 = vrcpps_avx(auVar71);
            fVar108 = auVar8._0_4_;
            fVar111 = auVar8._4_4_;
            auVar16._4_4_ = auVar71._4_4_ * fVar111;
            auVar16._0_4_ = auVar71._0_4_ * fVar108;
            fVar112 = auVar8._8_4_;
            auVar16._8_4_ = auVar71._8_4_ * fVar112;
            fVar114 = auVar8._12_4_;
            auVar16._12_4_ = auVar71._12_4_ * fVar114;
            fVar115 = auVar8._16_4_;
            auVar16._16_4_ = auVar71._16_4_ * fVar115;
            fVar116 = auVar8._20_4_;
            auVar16._20_4_ = auVar71._20_4_ * fVar116;
            fVar117 = auVar8._24_4_;
            auVar16._24_4_ = auVar71._24_4_ * fVar117;
            auVar16._28_4_ = fVar93;
            auVar61._8_4_ = 0x3f800000;
            auVar61._0_8_ = 0x3f8000003f800000;
            auVar61._12_4_ = 0x3f800000;
            auVar61._16_4_ = 0x3f800000;
            auVar61._20_4_ = 0x3f800000;
            auVar61._24_4_ = 0x3f800000;
            auVar61._28_4_ = 0x3f800000;
            auVar8 = vsubps_avx(auVar61,auVar16);
            fVar108 = fVar108 + fVar108 * auVar8._0_4_;
            fVar111 = fVar111 + fVar111 * auVar8._4_4_;
            fVar112 = fVar112 + fVar112 * auVar8._8_4_;
            fVar114 = fVar114 + fVar114 * auVar8._12_4_;
            fVar115 = fVar115 + fVar115 * auVar8._16_4_;
            fVar116 = fVar116 + fVar116 * auVar8._20_4_;
            fVar117 = fVar117 + fVar117 * auVar8._24_4_;
            auVar71 = vrcpps_avx(auVar9);
            fVar89 = auVar71._0_4_;
            fVar93 = auVar71._4_4_;
            auVar17._4_4_ = auVar9._4_4_ * fVar93;
            auVar17._0_4_ = auVar9._0_4_ * fVar89;
            fVar94 = auVar71._8_4_;
            auVar17._8_4_ = auVar9._8_4_ * fVar94;
            fVar95 = auVar71._12_4_;
            auVar17._12_4_ = auVar9._12_4_ * fVar95;
            fVar96 = auVar71._16_4_;
            auVar17._16_4_ = auVar9._16_4_ * fVar96;
            fVar97 = auVar71._20_4_;
            auVar17._20_4_ = auVar9._20_4_ * fVar97;
            fVar98 = auVar71._24_4_;
            auVar17._24_4_ = auVar9._24_4_ * fVar98;
            auVar17._28_4_ = auVar8._28_4_;
            auVar9 = vsubps_avx(auVar61,auVar17);
            auVar71 = vrcpps_avx(auVar91);
            fVar89 = fVar89 + fVar89 * auVar9._0_4_;
            fVar93 = fVar93 + fVar93 * auVar9._4_4_;
            fVar94 = fVar94 + fVar94 * auVar9._8_4_;
            fVar95 = fVar95 + fVar95 * auVar9._12_4_;
            fVar96 = fVar96 + fVar96 * auVar9._16_4_;
            fVar97 = fVar97 + fVar97 * auVar9._20_4_;
            fVar98 = fVar98 + fVar98 * auVar9._24_4_;
            fVar99 = auVar71._0_4_;
            fVar101 = auVar71._4_4_;
            auVar8._4_4_ = fVar101 * auVar91._4_4_;
            auVar8._0_4_ = fVar99 * auVar91._0_4_;
            fVar102 = auVar71._8_4_;
            auVar8._8_4_ = fVar102 * auVar91._8_4_;
            fVar103 = auVar71._12_4_;
            auVar8._12_4_ = fVar103 * auVar91._12_4_;
            fVar104 = auVar71._16_4_;
            auVar8._16_4_ = fVar104 * auVar91._16_4_;
            fVar105 = auVar71._20_4_;
            auVar8._20_4_ = fVar105 * auVar91._20_4_;
            fVar106 = auVar71._24_4_;
            auVar8._24_4_ = fVar106 * auVar91._24_4_;
            auVar8._28_4_ = auVar9._28_4_;
            auVar71 = vsubps_avx(auVar61,auVar8);
            fVar73 = auVar91._28_4_ + *(float *)(uVar31 + 0x17c);
            fVar99 = fVar99 + fVar99 * auVar71._0_4_;
            fVar101 = fVar101 + fVar101 * auVar71._4_4_;
            fVar102 = fVar102 + fVar102 * auVar71._8_4_;
            fVar103 = fVar103 + fVar103 * auVar71._12_4_;
            fVar104 = fVar104 + fVar104 * auVar71._16_4_;
            fVar105 = fVar105 + fVar105 * auVar71._20_4_;
            fVar106 = fVar106 + fVar106 * auVar71._24_4_;
            fVar55 = auVar71._28_4_ + fVar73;
            fVar79 = *(float *)(uVar31 + 0x13c) +
                     *(float *)(uVar31 + 0xbc) + *(float *)(uVar31 + 0x1bc);
            auVar83._0_4_ =
                 local_2520 * local_2440 +
                 local_2540 * *(float *)(uVar31 + 0xa0) +
                 *(float *)(uVar31 + 0x100) * local_2560 + *(float *)(uVar31 + 0x160);
            auVar83._4_4_ =
                 fStack_251c * fStack_243c +
                 fStack_253c * *(float *)(uVar31 + 0xa4) +
                 *(float *)(uVar31 + 0x104) * fStack_255c + *(float *)(uVar31 + 0x164);
            auVar83._8_4_ =
                 fStack_2518 * fStack_2438 +
                 fStack_2538 * *(float *)(uVar31 + 0xa8) +
                 *(float *)(uVar31 + 0x108) * fStack_2558 + *(float *)(uVar31 + 0x168);
            auVar83._12_4_ =
                 fStack_2514 * fStack_2434 +
                 fStack_2534 * *(float *)(uVar31 + 0xac) +
                 *(float *)(uVar31 + 0x10c) * fStack_2554 + *(float *)(uVar31 + 0x16c);
            auVar83._16_4_ =
                 fStack_2510 * fStack_2430 +
                 fStack_2530 * *(float *)(uVar31 + 0xb0) +
                 *(float *)(uVar31 + 0x110) * fStack_2550 + *(float *)(uVar31 + 0x170);
            auVar83._20_4_ =
                 fStack_250c * fStack_242c +
                 fStack_252c * *(float *)(uVar31 + 0xb4) +
                 *(float *)(uVar31 + 0x114) * fStack_254c + *(float *)(uVar31 + 0x174);
            auVar83._24_4_ =
                 fStack_2508 * fStack_2428 +
                 fStack_2528 * *(float *)(uVar31 + 0xb8) +
                 *(float *)(uVar31 + 0x118) * fStack_2548 + *(float *)(uVar31 + 0x178);
            auVar83._28_4_ = *(float *)(uVar31 + 0x13c) + fVar55;
            auVar85._0_4_ =
                 local_2520 * *(float *)(uVar31 + 0x60) +
                 local_2540 * local_2480 +
                 local_2560 * *(float *)(uVar31 + 0x120) + *(float *)(uVar31 + 0x180);
            auVar85._4_4_ =
                 fStack_251c * *(float *)(uVar31 + 100) +
                 fStack_253c * fStack_247c +
                 fStack_255c * *(float *)(uVar31 + 0x124) + *(float *)(uVar31 + 0x184);
            auVar85._8_4_ =
                 fStack_2518 * *(float *)(uVar31 + 0x68) +
                 fStack_2538 * fStack_2478 +
                 fStack_2558 * *(float *)(uVar31 + 0x128) + *(float *)(uVar31 + 0x188);
            auVar85._12_4_ =
                 fStack_2514 * *(float *)(uVar31 + 0x6c) +
                 fStack_2534 * fStack_2474 +
                 fStack_2554 * *(float *)(uVar31 + 300) + *(float *)(uVar31 + 0x18c);
            auVar85._16_4_ =
                 fStack_2510 * *(float *)(uVar31 + 0x70) +
                 fStack_2530 * fStack_2470 +
                 fStack_2550 * *(float *)(uVar31 + 0x130) + *(float *)(uVar31 + 400);
            auVar85._20_4_ =
                 fStack_250c * *(float *)(uVar31 + 0x74) +
                 fStack_252c * fStack_246c +
                 fStack_254c * *(float *)(uVar31 + 0x134) + *(float *)(uVar31 + 0x194);
            auVar85._24_4_ =
                 fStack_2508 * *(float *)(uVar31 + 0x78) +
                 fStack_2528 * fStack_2468 +
                 fStack_2548 * *(float *)(uVar31 + 0x138) + *(float *)(uVar31 + 0x198);
            auVar85._28_4_ =
                 fVar55 + *(float *)(uVar31 + 0xbc) + fVar73 + *(float *)(uVar31 + 0x19c);
            auVar88._0_4_ =
                 local_2520 * *(float *)(uVar31 + 0x80) +
                 local_2540 * local_2460 +
                 *(float *)(uVar31 + 0x140) * local_2560 + *(float *)(uVar31 + 0x1a0);
            auVar88._4_4_ =
                 fStack_251c * *(float *)(uVar31 + 0x84) +
                 fStack_253c * fStack_245c +
                 *(float *)(uVar31 + 0x144) * fStack_255c + *(float *)(uVar31 + 0x1a4);
            auVar88._8_4_ =
                 fStack_2518 * *(float *)(uVar31 + 0x88) +
                 fStack_2538 * fStack_2458 +
                 *(float *)(uVar31 + 0x148) * fStack_2558 + *(float *)(uVar31 + 0x1a8);
            auVar88._12_4_ =
                 fStack_2514 * *(float *)(uVar31 + 0x8c) +
                 fStack_2534 * fStack_2454 +
                 *(float *)(uVar31 + 0x14c) * fStack_2554 + *(float *)(uVar31 + 0x1ac);
            auVar88._16_4_ =
                 fStack_2510 * *(float *)(uVar31 + 0x90) +
                 fStack_2530 * fStack_2450 +
                 *(float *)(uVar31 + 0x150) * fStack_2550 + *(float *)(uVar31 + 0x1b0);
            auVar88._20_4_ =
                 fStack_250c * *(float *)(uVar31 + 0x94) +
                 fStack_252c * fStack_244c +
                 *(float *)(uVar31 + 0x154) * fStack_254c + *(float *)(uVar31 + 0x1b4);
            auVar88._24_4_ =
                 fStack_2508 * *(float *)(uVar31 + 0x98) +
                 fStack_2528 * fStack_2448 +
                 *(float *)(uVar31 + 0x158) * fStack_2548 + *(float *)(uVar31 + 0x1b8);
            auVar88._28_4_ = fVar55 + fVar79;
            auVar91 = vsubps_avx(_local_2640,auVar83);
            auVar28._4_4_ = fStack_23fc;
            auVar28._0_4_ = local_2400;
            auVar28._8_4_ = fStack_23f8;
            auVar28._12_4_ = fStack_23f4;
            auVar28._16_4_ = fStack_23f0;
            auVar28._20_4_ = fStack_23ec;
            auVar28._24_4_ = fStack_23e8;
            auVar28._28_4_ = fStack_23e4;
            auVar71 = vsubps_avx(auVar28,auVar85);
            auVar27._4_4_ = fStack_241c;
            auVar27._0_4_ = local_2420;
            auVar27._8_4_ = fStack_2418;
            auVar27._12_4_ = fStack_2414;
            auVar27._16_4_ = fStack_2410;
            auVar27._20_4_ = fStack_240c;
            auVar27._24_4_ = fStack_2408;
            auVar27._28_4_ = fVar113 + fVar7;
            auVar9 = vsubps_avx(auVar27,auVar88);
            auVar75._0_4_ = fVar108 * auVar91._0_4_;
            auVar75._4_4_ = fVar111 * auVar91._4_4_;
            auVar75._8_4_ = fVar112 * auVar91._8_4_;
            auVar75._12_4_ = fVar114 * auVar91._12_4_;
            auVar18._16_4_ = fVar115 * auVar91._16_4_;
            auVar18._0_16_ = auVar75;
            auVar18._20_4_ = fVar116 * auVar91._20_4_;
            auVar18._24_4_ = fVar117 * auVar91._24_4_;
            auVar18._28_4_ = fVar79;
            auVar67._0_4_ = fVar89 * auVar71._0_4_;
            auVar67._4_4_ = fVar93 * auVar71._4_4_;
            auVar67._8_4_ = fVar94 * auVar71._8_4_;
            auVar67._12_4_ = fVar95 * auVar71._12_4_;
            auVar19._16_4_ = fVar96 * auVar71._16_4_;
            auVar19._0_16_ = auVar67;
            auVar19._20_4_ = fVar97 * auVar71._20_4_;
            auVar19._24_4_ = fVar98 * auVar71._24_4_;
            auVar19._28_4_ = auVar71._28_4_;
            auVar50._0_4_ = auVar9._0_4_ * fVar99;
            auVar50._4_4_ = auVar9._4_4_ * fVar101;
            auVar50._8_4_ = auVar9._8_4_ * fVar102;
            auVar50._12_4_ = auVar9._12_4_ * fVar103;
            auVar20._16_4_ = auVar9._16_4_ * fVar104;
            auVar20._0_16_ = auVar50;
            auVar20._20_4_ = auVar9._20_4_ * fVar105;
            auVar20._24_4_ = auVar9._24_4_ * fVar106;
            auVar20._28_4_ = auVar91._28_4_;
            auVar91 = vsubps_avx(auVar118,auVar83);
            auVar9._4_4_ = fStack_249c;
            auVar9._0_4_ = local_24a0;
            auVar9._8_4_ = fStack_2498;
            auVar9._12_4_ = fStack_2494;
            auVar9._16_4_ = fStack_2490;
            auVar9._20_4_ = fStack_248c;
            auVar9._24_4_ = fStack_2488;
            auVar9._28_4_ = fStack_2484;
            auVar71 = vsubps_avx(auVar9,auVar85);
            auVar9 = vsubps_avx(auVar120,auVar88);
            auVar57._0_4_ = fVar108 * auVar91._0_4_;
            auVar57._4_4_ = fVar111 * auVar91._4_4_;
            auVar57._8_4_ = fVar112 * auVar91._8_4_;
            auVar57._12_4_ = fVar114 * auVar91._12_4_;
            auVar21._16_4_ = fVar115 * auVar91._16_4_;
            auVar21._0_16_ = auVar57;
            auVar21._20_4_ = fVar116 * auVar91._20_4_;
            auVar21._24_4_ = fVar117 * auVar91._24_4_;
            auVar21._28_4_ = 0x3f800000;
            auVar81._0_4_ = fVar89 * auVar71._0_4_;
            auVar81._4_4_ = fVar93 * auVar71._4_4_;
            auVar81._8_4_ = fVar94 * auVar71._8_4_;
            auVar81._12_4_ = fVar95 * auVar71._12_4_;
            auVar22._16_4_ = fVar96 * auVar71._16_4_;
            auVar22._0_16_ = auVar81;
            auVar22._20_4_ = fVar97 * auVar71._20_4_;
            auVar22._24_4_ = fVar98 * auVar71._24_4_;
            auVar22._28_4_ = auVar91._28_4_;
            auVar44._0_4_ = auVar9._0_4_ * fVar99;
            auVar44._4_4_ = auVar9._4_4_ * fVar101;
            auVar44._8_4_ = auVar9._8_4_ * fVar102;
            auVar44._12_4_ = auVar9._12_4_ * fVar103;
            auVar23._16_4_ = auVar9._16_4_ * fVar104;
            auVar23._0_16_ = auVar44;
            auVar23._20_4_ = auVar9._20_4_ * fVar105;
            auVar23._24_4_ = auVar9._24_4_ * fVar106;
            auVar23._28_4_ = fStack_2484;
            auVar43 = vpminsd_avx(auVar18._16_16_,auVar21._16_16_);
            auVar42 = vpminsd_avx(auVar75,auVar57);
            register0x00001450 = auVar43;
            _local_2640 = auVar42;
            auVar43 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar42 = vpminsd_avx(auVar67,auVar81);
            auVar109._16_16_ = auVar43;
            auVar109._0_16_ = auVar42;
            auVar54 = auVar20._16_16_;
            in_ZMM14 = ZEXT1664(auVar54);
            auVar43 = vpminsd_avx(auVar54,auVar23._16_16_);
            auVar42 = vpminsd_avx(auVar50,auVar44);
            auVar91._16_16_ = auVar43;
            auVar91._0_16_ = auVar42;
            auVar91 = vmaxps_avx(auVar109,auVar91);
            auVar110 = ZEXT3264(local_25e0);
            auVar43 = vpmaxsd_avx(auVar18._16_16_,auVar21._16_16_);
            auVar42 = vpmaxsd_avx(auVar75,auVar57);
            auVar62._16_16_ = auVar43;
            auVar62._0_16_ = auVar42;
            auVar43 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
            auVar107 = ZEXT3264(local_25c0);
            auVar100 = ZEXT3264(local_25a0);
            auVar42 = vpmaxsd_avx(auVar67,auVar81);
            auVar71._16_16_ = auVar43;
            auVar71._0_16_ = auVar42;
            auVar43 = vpmaxsd_avx(auVar54,auVar23._16_16_);
            auVar78 = ZEXT1664(auVar43);
            auVar42 = vpmaxsd_avx(auVar50,auVar44);
            auVar49._16_16_ = auVar43;
            auVar49._0_16_ = auVar42;
            auVar8 = vminps_avx(auVar71,auVar49);
            auVar9 = vmaxps_avx(local_25e0,_local_2640);
            auVar91 = vmaxps_avx(auVar9,auVar91);
            auVar53 = ZEXT3264(auVar91);
            auVar92 = ZEXT3264(local_2580);
            auVar9 = vminps_avx(auVar41._0_32_,auVar62);
            auVar9 = vminps_avx(auVar9,auVar8);
            auVar91 = vcmpps_avx(auVar91,auVar9,2);
LAB_00e4f022:
            auVar63 = ZEXT1664(auVar91._16_16_);
            auVar43 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
          }
          else {
            auVar43 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
            auVar47._16_16_ = auVar43;
            auVar47._0_16_ = auVar43;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar36);
            fVar108 = auVar43._0_4_;
            fVar89 = auVar43._4_4_;
            fVar111 = auVar43._8_4_;
            fVar93 = auVar43._12_4_;
            pfVar1 = (float *)(uVar31 + 0x40 + uVar36);
            auVar52._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar52._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar52._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar52._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar52._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar52._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar52._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar52._28_4_ = auVar53._28_4_ + pfVar1[7];
            auVar26._4_4_ = fStack_251c;
            auVar26._0_4_ = local_2520;
            auVar26._8_4_ = fStack_2518;
            auVar26._12_4_ = fStack_2514;
            auVar26._16_4_ = fStack_2510;
            auVar26._20_4_ = fStack_250c;
            auVar26._24_4_ = fStack_2508;
            auVar26._28_4_ = fStack_2504;
            auVar91 = vsubps_avx(auVar52,auVar26);
            auVar11._4_4_ = auVar92._4_4_ * auVar91._4_4_;
            auVar11._0_4_ = auVar92._0_4_ * auVar91._0_4_;
            auVar11._8_4_ = auVar92._8_4_ * auVar91._8_4_;
            auVar11._12_4_ = auVar92._12_4_ * auVar91._12_4_;
            auVar11._16_4_ = auVar92._16_4_ * auVar91._16_4_;
            auVar11._20_4_ = auVar92._20_4_ * auVar91._20_4_;
            auVar11._24_4_ = auVar92._24_4_ * auVar91._24_4_;
            auVar11._28_4_ = auVar91._28_4_;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar38);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar38);
            auVar59._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar59._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar59._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar59._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar59._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar59._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar59._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar59._28_4_ = auVar63._28_4_ + pfVar1[7];
            auVar25._4_4_ = fStack_253c;
            auVar25._0_4_ = local_2540;
            auVar25._8_4_ = fStack_2538;
            auVar25._12_4_ = fStack_2534;
            auVar25._16_4_ = fStack_2530;
            auVar25._20_4_ = fStack_252c;
            auVar25._24_4_ = fStack_2528;
            auVar25._28_4_ = fStack_2524;
            auVar91 = vsubps_avx(auVar59,auVar25);
            auVar12._4_4_ = auVar100._4_4_ * auVar91._4_4_;
            auVar12._0_4_ = auVar100._0_4_ * auVar91._0_4_;
            auVar12._8_4_ = auVar100._8_4_ * auVar91._8_4_;
            auVar12._12_4_ = auVar100._12_4_ * auVar91._12_4_;
            auVar12._16_4_ = auVar100._16_4_ * auVar91._16_4_;
            auVar12._20_4_ = auVar100._20_4_ * auVar91._20_4_;
            auVar12._24_4_ = auVar100._24_4_ * auVar91._24_4_;
            auVar12._28_4_ = auVar91._28_4_;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar37);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar37);
            auVar68._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar68._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar68._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar68._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar68._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar68._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar68._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar68._28_4_ = auVar72._28_4_ + pfVar1[7];
            auVar24._4_4_ = fStack_255c;
            auVar24._0_4_ = local_2560;
            auVar24._8_4_ = fStack_2558;
            auVar24._12_4_ = fStack_2554;
            auVar24._16_4_ = fStack_2550;
            auVar24._20_4_ = fStack_254c;
            auVar24._24_4_ = fStack_2548;
            auVar24._28_4_ = fStack_2544;
            auVar91 = vsubps_avx(auVar68,auVar24);
            auVar13._4_4_ = auVar107._4_4_ * auVar91._4_4_;
            auVar13._0_4_ = auVar107._0_4_ * auVar91._0_4_;
            auVar13._8_4_ = auVar107._8_4_ * auVar91._8_4_;
            auVar13._12_4_ = auVar107._12_4_ * auVar91._12_4_;
            auVar13._16_4_ = auVar107._16_4_ * auVar91._16_4_;
            auVar13._20_4_ = auVar107._20_4_ * auVar91._20_4_;
            auVar13._24_4_ = auVar107._24_4_ * auVar91._24_4_;
            auVar13._28_4_ = auVar91._28_4_;
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar36 ^ 0x20));
            auVar91 = vmaxps_avx(auVar12,auVar13);
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar36 ^ 0x20));
            auVar69._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar69._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar69._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar69._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar69._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar69._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar69._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar69._28_4_ = auVar78._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar69,auVar26);
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar38 ^ 0x20));
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar38 ^ 0x20));
            auVar77._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar77._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar77._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar77._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar77._28_4_ = auVar78._28_4_ + pfVar1[7];
            auVar71._4_4_ = auVar92._4_4_ * auVar9._4_4_;
            auVar71._0_4_ = auVar92._0_4_ * auVar9._0_4_;
            auVar71._8_4_ = auVar92._8_4_ * auVar9._8_4_;
            auVar71._12_4_ = auVar92._12_4_ * auVar9._12_4_;
            auVar71._16_4_ = auVar92._16_4_ * auVar9._16_4_;
            auVar71._20_4_ = auVar92._20_4_ * auVar9._20_4_;
            auVar71._24_4_ = auVar92._24_4_ * auVar9._24_4_;
            auVar71._28_4_ = auVar9._28_4_;
            auVar9 = vsubps_avx(auVar77,auVar25);
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar37 ^ 0x20));
            auVar14._4_4_ = auVar100._4_4_ * auVar9._4_4_;
            auVar14._0_4_ = auVar100._0_4_ * auVar9._0_4_;
            auVar14._8_4_ = auVar100._8_4_ * auVar9._8_4_;
            auVar14._12_4_ = auVar100._12_4_ * auVar9._12_4_;
            auVar14._16_4_ = auVar100._16_4_ * auVar9._16_4_;
            auVar14._20_4_ = auVar100._20_4_ * auVar9._20_4_;
            auVar14._24_4_ = auVar100._24_4_ * auVar9._24_4_;
            auVar14._28_4_ = auVar9._28_4_;
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar37 ^ 0x20));
            auVar82._0_4_ = fVar108 * *pfVar2 + *pfVar1;
            auVar82._4_4_ = fVar89 * pfVar2[1] + pfVar1[1];
            auVar82._8_4_ = fVar111 * pfVar2[2] + pfVar1[2];
            auVar82._12_4_ = fVar93 * pfVar2[3] + pfVar1[3];
            auVar82._16_4_ = fVar108 * pfVar2[4] + pfVar1[4];
            auVar82._20_4_ = fVar89 * pfVar2[5] + pfVar1[5];
            auVar82._24_4_ = fVar111 * pfVar2[6] + pfVar1[6];
            auVar82._28_4_ = fStack_2504 + pfVar1[7];
            auVar9 = vsubps_avx(auVar82,auVar24);
            auVar15._4_4_ = auVar107._4_4_ * auVar9._4_4_;
            auVar15._0_4_ = auVar107._0_4_ * auVar9._0_4_;
            auVar15._8_4_ = auVar107._8_4_ * auVar9._8_4_;
            auVar15._12_4_ = auVar107._12_4_ * auVar9._12_4_;
            auVar15._16_4_ = auVar107._16_4_ * auVar9._16_4_;
            auVar15._20_4_ = auVar107._20_4_ * auVar9._20_4_;
            auVar15._24_4_ = auVar107._24_4_ * auVar9._24_4_;
            auVar15._28_4_ = auVar9._28_4_;
            auVar8 = vminps_avx(auVar14,auVar15);
            auVar78 = ZEXT3264(auVar8);
            auVar9 = vmaxps_avx(auVar110._0_32_,auVar11);
            auVar91 = vmaxps_avx(auVar9,auVar91);
            auVar53 = ZEXT3264(auVar91);
            auVar9 = vminps_avx(auVar41._0_32_,auVar71);
            auVar9 = vminps_avx(auVar9,auVar8);
            auVar91 = vcmpps_avx(auVar91,auVar9,2);
            auVar63 = ZEXT3264(auVar91);
            if (uVar29 == 6) {
              auVar71 = vcmpps_avx(*(undefined1 (*) [32])(uVar31 + 0x1c0),auVar47,2);
              auVar9 = vcmpps_avx(auVar47,*(undefined1 (*) [32])(uVar31 + 0x1e0),1);
              auVar9 = vandps_avx(auVar71,auVar9);
              auVar91 = vandps_avx(auVar9,auVar91);
              goto LAB_00e4f022;
            }
            auVar43 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
          }
          auVar72 = ZEXT3264(auVar71);
          local_2600 = auVar53._0_32_;
          auVar43 = vpsllw_avx(auVar43,0xf);
          if ((((((((auVar43 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar43 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar43 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar43[0xf]) goto LAB_00e4eafa;
          auVar43 = vpacksswb_avx(auVar43,auVar43);
          bVar10 = SUB161(auVar43 >> 7,0) & 1 | (SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar43 >> 0x17,0) & 1) << 2 | (SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar43 >> 0x27,0) & 1) << 4 | (SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar43 >> 0x37,0) & 1) << 6 | SUB161(auVar43 >> 0x3f,0) << 7;
          lVar32 = 0;
          if (bVar10 != 0) {
            for (; (bVar10 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
          uVar33 = *(ulong *)(uVar31 + lVar32 * 8);
          uVar29 = bVar10 - 1 & (uint)bVar10;
          if (uVar29 != 0) {
            local_2640 = (undefined1  [8])pauVar35;
            uVar4 = *(uint *)(local_2600 + lVar32 * 4);
            lVar32 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar6 = *(ulong *)(uVar31 + lVar32 * 8);
            uVar5 = *(uint *)(local_2600 + lVar32 * 4);
            uVar29 = uVar29 - 1 & uVar29;
            if (uVar29 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar35 = uVar6;
                *(uint *)(*pauVar35 + 8) = uVar5;
                pauVar35 = pauVar35 + 1;
              }
              else {
                *(ulong *)*pauVar35 = uVar33;
                *(uint *)(*pauVar35 + 8) = uVar4;
                uVar33 = uVar6;
                pauVar35 = pauVar35 + 1;
              }
            }
            else {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = uVar33;
              auVar43 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar4));
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar6;
              auVar42 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar5));
              lVar32 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(uVar31 + lVar32 * 8);
              auVar56 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_2600 + lVar32 * 4)));
              auVar63 = ZEXT1664(auVar56);
              auVar54 = vpcmpgtd_avx(auVar42,auVar43);
              auVar72 = ZEXT1664(auVar54);
              uVar29 = uVar29 - 1 & uVar29;
              if (uVar29 == 0) {
                auVar39 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar42,auVar43,auVar39);
                auVar43 = vblendvps_avx(auVar43,auVar42,auVar39);
                auVar42 = vpcmpgtd_avx(auVar56,auVar54);
                auVar39 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar56,auVar54,auVar39);
                auVar72 = ZEXT1664(auVar42);
                auVar54 = vblendvps_avx(auVar54,auVar56,auVar39);
                auVar53 = ZEXT1664(auVar54);
                auVar56 = vpcmpgtd_avx(auVar54,auVar43);
                auVar39 = vpshufd_avx(auVar56,0xaa);
                auVar63 = ZEXT1664(auVar39);
                auVar56 = vblendvps_avx(auVar54,auVar43,auVar39);
                auVar78 = ZEXT1664(auVar56);
                auVar43 = vblendvps_avx(auVar43,auVar54,auVar39);
                *pauVar35 = auVar43;
                pauVar35[1] = auVar56;
                uVar33 = auVar42._0_8_;
                pauVar35 = pauVar35 + 2;
              }
              else {
                lVar32 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)(uVar31 + lVar32 * 8);
                auVar39 = vpunpcklqdq_avx(auVar76,ZEXT416(*(uint *)(local_2600 + lVar32 * 4)));
                auVar78 = ZEXT1664(auVar39);
                uVar29 = uVar29 - 1 & uVar29;
                uVar33 = (ulong)uVar29;
                if (uVar29 == 0) {
                  auVar74 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar42,auVar43,auVar74);
                  auVar43 = vblendvps_avx(auVar43,auVar42,auVar74);
                  auVar42 = vpcmpgtd_avx(auVar39,auVar56);
                  auVar74 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar39,auVar56,auVar74);
                  auVar56 = vblendvps_avx(auVar56,auVar39,auVar74);
                  auVar39 = vpcmpgtd_avx(auVar56,auVar43);
                  auVar74 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar56,auVar43,auVar74);
                  auVar78 = ZEXT1664(auVar39);
                  auVar43 = vblendvps_avx(auVar43,auVar56,auVar74);
                  auVar56 = vpcmpgtd_avx(auVar42,auVar54);
                  auVar74 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar42,auVar54,auVar74);
                  auVar63 = ZEXT1664(auVar56);
                  auVar42 = vblendvps_avx(auVar54,auVar42,auVar74);
                  auVar54 = vpcmpgtd_avx(auVar39,auVar42);
                  auVar74 = vpshufd_avx(auVar54,0xaa);
                  auVar72 = ZEXT1664(auVar74);
                  auVar54 = vblendvps_avx(auVar39,auVar42,auVar74);
                  auVar42 = vblendvps_avx(auVar42,auVar39,auVar74);
                  auVar53 = ZEXT1664(auVar42);
                  *pauVar35 = auVar43;
                  pauVar35[1] = auVar42;
                  pauVar35[2] = auVar54;
                  uVar33 = auVar56._0_8_;
                  pauVar35 = pauVar35 + 3;
                }
                else {
                  *pauVar35 = auVar43;
                  pauVar35[1] = auVar42;
                  pauVar35[2] = auVar56;
                  pauVar30 = pauVar35 + 3;
                  pauVar35[3] = auVar39;
                  do {
                    lVar32 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    auVar53 = ZEXT464(*(uint *)(local_2600 + lVar32 * 4));
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = *(ulong *)(uVar31 + lVar32 * 8);
                    auVar43 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2600 + lVar32 * 4)));
                    pauVar30[1] = auVar43;
                    pauVar30 = pauVar30 + 1;
                    uVar33 = uVar33 & uVar33 - 1;
                  } while (uVar33 != 0);
                  lVar32 = 0;
                  while ((undefined1  [8])pauVar30 != local_2640) {
                    auVar43 = *(undefined1 (*) [16])((long)local_2640 + 0x10);
                    uVar29 = vextractps_avx(auVar43,2);
                    for (lVar34 = 0x10;
                        (lVar32 != lVar34 &&
                        (*(uint *)(*(undefined1 (*) [16])((long)local_2640 + -0x10) + lVar34 + 8) <
                         uVar29)); lVar34 = lVar34 + -0x10) {
                      auVar53 = ZEXT1664(*(undefined1 (*) [16])
                                          (*(undefined1 (*) [16])((long)local_2640 + -0x10) + lVar34
                                          ));
                      *(undefined1 (*) [16])((undefined1 *)local_2640 + lVar34) =
                           *(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)local_2640 + -0x10) + lVar34);
                    }
                    *(undefined1 (*) [16])((undefined1 *)local_2640 + lVar34) = auVar43;
                    lVar32 = lVar32 + -0x10;
                    local_2640 = (undefined1  [8])((long)local_2640 + 0x10);
                  }
                  uVar33 = *(ulong *)*pauVar30;
                  auVar92 = ZEXT3264(local_2580);
                  auVar100 = ZEXT3264(local_25a0);
                  auVar107 = ZEXT3264(local_25c0);
                  auVar110 = ZEXT3264(local_25e0);
                  pauVar35 = pauVar30;
                }
              }
            }
          }
        }
        local_2640 = (undefined1  [8])pauVar35;
        auVar53 = ZEXT1664(auVar53._0_16_);
        auVar63 = ZEXT1664(auVar63._0_16_);
        auVar72 = ZEXT1664(auVar72._0_16_);
        auVar78 = ZEXT1664(auVar78._0_16_);
        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar33 & 0xfffffffffffffff0) * 0x40))(local_23e0,ray,context);
        auVar110 = ZEXT3264(local_25e0);
        auVar107 = ZEXT3264(local_25c0);
        auVar100 = ZEXT3264(local_25a0);
        auVar92 = ZEXT3264(local_2580);
        fVar108 = (ray->super_RayK<1>).tfar;
        auVar41 = ZEXT3264(CONCAT428(fVar108,CONCAT424(fVar108,CONCAT420(fVar108,CONCAT416(fVar108,
                                                  CONCAT412(fVar108,CONCAT48(fVar108,CONCAT44(
                                                  fVar108,fVar108))))))));
      }
      goto LAB_00e4eafa;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }